

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intelligibility_enhancer.cc
# Opt level: O2

void __thiscall
webrtc::IntelligibilityEnhancer::SolveForGainsGivenLambda
          (IntelligibilityEnhancer *this,float lambda,size_t start_freq,float *sols)

{
  pointer pfVar1;
  pointer pfVar2;
  size_t n;
  size_t sVar3;
  string *result;
  float fVar4;
  float fVar5;
  float alpha0;
  float local_1bc;
  float local_1b8;
  float local_1b4;
  float local_1b0;
  float local_1ac;
  FatalMessage local_1a8;
  
  pfVar1 = (this->filtered_clear_pow_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (this->filtered_noise_pow_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (sVar3 = 0; start_freq != sVar3; sVar3 = sVar3 + 1) {
    sols[sVar3] = 1.0;
  }
  local_1b8 = lambda;
  do {
    if (this->bank_size_ <= start_freq) {
      return;
    }
    local_1b4 = pfVar1[start_freq];
    if ((local_1b4 < 1e-05) || (local_1ac = pfVar2[start_freq], local_1ac < 1e-05)) {
      sols[start_freq] = 1.0;
    }
    else {
      local_1b0 = local_1b4 * local_1b8;
      local_1bc = local_1b0 * 0.9996 * local_1b4 * local_1b4;
      local_1a8.stream_ = (ostringstream)0x0;
      local_1a8._1_3_ = 0;
      result = rtc::CheckLTImpl<float,float>(&local_1bc,(float *)&local_1a8,"alpha0 < 0.f");
      if (result != (string *)0x0) {
        rtc::FatalMessage::FatalMessage
                  (&local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/intelligibility/intelligibility_enhancer.cc"
                   ,0x145,result);
        rtc::FatalMessage::~FatalMessage(&local_1a8);
      }
      fVar4 = local_1b0 * 1.9996 * local_1b4 * local_1ac;
      fVar5 = fVar4 * fVar4 +
              local_1bc * -4.0 *
              (local_1b4 * 0.0002 * local_1ac + local_1b0 * local_1ac * local_1ac);
      if (fVar5 <= 0.0) {
        fVar5 = 0.0;
      }
      fVar4 = (-fVar4 - SQRT(fVar5)) / (local_1bc + local_1bc);
      if (fVar4 <= 0.0) {
        fVar4 = 0.0;
      }
      sols[start_freq] = fVar4;
    }
    start_freq = start_freq + 1;
  } while( true );
}

Assistant:

void IntelligibilityEnhancer::SolveForGainsGivenLambda(float lambda,
                                                       size_t start_freq,
                                                       float* sols) {
  const float kMinPower = 1e-5f;

  const float* pow_x0 = filtered_clear_pow_.data();
  const float* pow_n0 = filtered_noise_pow_.data();

  for (size_t n = 0; n < start_freq; ++n) {
    sols[n] = 1.f;
  }

  // Analytic solution for optimal gains. See paper for derivation.
  for (size_t n = start_freq; n < bank_size_; ++n) {
    if (pow_x0[n] < kMinPower || pow_n0[n] < kMinPower) {
      sols[n] = 1.f;
    } else {
      const float gamma0 = 0.5f * kRho * pow_x0[n] * pow_n0[n] +
                           lambda * pow_x0[n] * pow_n0[n] * pow_n0[n];
      const float beta0 =
          lambda * pow_x0[n] * (2.f - kRho) * pow_x0[n] * pow_n0[n];
      const float alpha0 =
          lambda * pow_x0[n] * (1.f - kRho) * pow_x0[n] * pow_x0[n];
      RTC_DCHECK_LT(alpha0, 0.f);
      // The quadratic equation should always have real roots, but to guard
      // against numerical errors we limit it to a minimum of zero.
      sols[n] = std::max(
          0.f, (-beta0 - std::sqrt(std::max(
                             0.f, beta0 * beta0 - 4.f * alpha0 * gamma0))) /
                   (2.f * alpha0));
    }
  }
}